

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::InnerProduct3D_1D::dim_forward
          (Dim *__return_storage_ptr__,InnerProduct3D_1D *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  int iVar3;
  long lVar4;
  invalid_argument *piVar5;
  uint uVar6;
  long lVar7;
  ostringstream s;
  string local_1b0 [32];
  undefined8 local_190 [47];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pDVar2;
  if (((lVar4 >> 2) * -0x71c71c71c71c71c7 & 0xfffffffffffffffeU) != 2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar5,"Expected two or three arguments in InnerProduct3D_1D");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((pDVar2->nd != 3) || (pDVar2[1].nd != 1)) || (pDVar2->d[2] != pDVar2[1].d[0])) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Bad input dimensions in InnerProduct3D_1D: ",0x2b);
    operator<<((ostream *)local_190,xs);
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar5,local_1b0);
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_190[0] = *(undefined8 *)pDVar2->d;
  uVar6 = pDVar2[1].bd;
  if (pDVar2[1].bd < pDVar2->bd) {
    uVar6 = pDVar2->bd;
  }
  __return_storage_ptr__->nd = 0;
  __return_storage_ptr__->bd = uVar6;
  lVar7 = 0;
  do {
    uVar6 = *(uint *)((long)local_190 + lVar7);
    uVar1 = __return_storage_ptr__->nd;
    __return_storage_ptr__->nd = uVar1 + 1;
    __return_storage_ptr__->d[uVar1] = uVar6;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 8);
  if (lVar4 != 0x6c) {
    return __return_storage_ptr__;
  }
  uVar6 = pDVar2[2].bd;
  if (pDVar2[2].bd < __return_storage_ptr__->bd) {
    uVar6 = __return_storage_ptr__->bd;
  }
  __return_storage_ptr__->bd = uVar6;
  if (((pDVar2[2].nd == __return_storage_ptr__->nd) && (pDVar2[2].bd == __return_storage_ptr__->bd))
     && (iVar3 = bcmp(pDVar2 + 2,__return_storage_ptr__,(ulong)pDVar2[2].nd), iVar3 == 0)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Bad input dimensions in InnerProduct3D_1D: ",0x2b);
  operator<<((ostream *)local_190,xs);
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar5,local_1b0);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 && xs.size() != 3)
    throw std::invalid_argument("Expected two or three arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[0].size(2) != xs[1].size(0)) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0), xs[0].size(1)}, max(xs[0].bd, xs[1].bd));
  if(xs.size() == 3) d.bd = max(d.bd, xs[2].bd);
  if (xs.size() == 3 && xs[2] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}